

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_job_queue_get_heap_size(ma_job_queue_config *pConfig,size_t *pHeapSizeInBytes)

{
  undefined1 local_40 [8];
  ma_job_queue_heap_layout layout;
  ma_result result;
  size_t *pHeapSizeInBytes_local;
  ma_job_queue_config *pConfig_local;
  
  if (pHeapSizeInBytes == (size_t *)0x0) {
    pConfig_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    *pHeapSizeInBytes = 0;
    pConfig_local._4_4_ = ma_job_queue_get_heap_layout(pConfig,(ma_job_queue_heap_layout *)local_40)
    ;
    if (pConfig_local._4_4_ == MA_SUCCESS) {
      *pHeapSizeInBytes = (size_t)local_40;
      pConfig_local._4_4_ = MA_SUCCESS;
    }
  }
  return pConfig_local._4_4_;
}

Assistant:

MA_API ma_result ma_job_queue_get_heap_size(const ma_job_queue_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_result result;
    ma_job_queue_heap_layout layout;

    if (pHeapSizeInBytes == NULL) {
        return MA_INVALID_ARGS;
    }

    *pHeapSizeInBytes = 0;

    result = ma_job_queue_get_heap_layout(pConfig, &layout);
    if (result != MA_SUCCESS) {
        return result;
    }

    *pHeapSizeInBytes = layout.sizeInBytes;

    return MA_SUCCESS;
}